

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestDouble_IsNan(void)

{
  bool in_CL;
  
  CheckHelper((char *)0xdc,0xc1ca82,(char *)0x1,in_CL);
  CheckHelper((char *)0xde,0xc1caa0,(char *)0x1,in_CL);
  CheckHelper((char *)0xdf,0xc1caba,(char *)0x1,in_CL);
  CheckHelper((char *)0xe0,0xc1cade,(char *)0x1,in_CL);
  CheckHelper((char *)0xe1,0xc1cb03,(char *)0x1,in_CL);
  CheckHelper((char *)0xe2,0xc1cb18,(char *)0x1,in_CL);
  CheckHelper((char *)0xe3,0xc1cb2e,(char *)0x1,in_CL);
  CheckHelper((char *)0xe4,0xc1cb43,(char *)0x1,in_CL);
  CheckHelper((char *)0xe6,0xc1cb59,(char *)0x1,in_CL);
  return;
}

Assistant:

TEST(Double_IsNan) {
  CHECK(Double(Double::NaN()).IsNan());
  uint64_t other_nan = DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, 00000001);
  CHECK(Double(other_nan).IsNan());
  CHECK(!Double(Double::Infinity()).IsNan());
  CHECK(!Double(-Double::Infinity()).IsNan());
  CHECK(!Double(0.0).IsNan());
  CHECK(!Double(-0.0).IsNan());
  CHECK(!Double(1.0).IsNan());
  CHECK(!Double(-1.0).IsNan());
  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK(!Double(min_double64).IsNan());
}